

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O3

void Wln_ObjPrint(Wln_Ntk_t *p,int iObj)

{
  Wln_Vec_t *pWVar1;
  int *piVar2;
  ulong uVar3;
  char *pcVar4;
  undefined4 in_register_00000034;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  if ((-1 < iObj) && (iObj < (p->vTypes).nSize)) {
    uVar7 = (ulong)(uint)iObj;
    switch((p->vTypes).pArray[uVar7]) {
    case 0:
    case 99:
      pcVar4 = (char *)0x0;
      break;
    case 1:
      pcVar4 = "pi";
      break;
    case 2:
      pcVar4 = "po";
      break;
    case 3:
      pcVar4 = "ci";
      break;
    case 4:
      pcVar4 = "co";
      break;
    case 5:
      pcVar4 = "fon";
      break;
    case 6:
      pcVar4 = "box";
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/abcOper.h"
                    ,0xe7,"const char *Abc_OperName(int)");
    case 0xb:
      pcVar4 = "buf";
      break;
    case 0xc:
      pcVar4 = "~";
      break;
    case 0xd:
    case 0x1e:
      pcVar4 = "&";
      break;
    case 0xe:
    case 0x1f:
      pcVar4 = "~&";
      break;
    case 0xf:
    case 0x20:
      pcVar4 = "|";
      break;
    case 0x10:
    case 0x21:
      pcVar4 = "~|";
      break;
    case 0x11:
    case 0x22:
      pcVar4 = "^";
      break;
    case 0x12:
    case 0x23:
      pcVar4 = "~^";
      break;
    case 0x15:
      pcVar4 = "mux";
      break;
    case 0x16:
      pcVar4 = "maj";
      break;
    case 0x24:
      pcVar4 = "!";
      break;
    case 0x25:
      pcVar4 = "&&";
      break;
    case 0x27:
      pcVar4 = "||";
      break;
    case 0x29:
      pcVar4 = "^^";
      break;
    case 0x32:
      pcVar4 = "+";
      break;
    case 0x33:
    case 0x3a:
      pcVar4 = "-";
      break;
    case 0x34:
    case 0x35:
      pcVar4 = "*";
      break;
    case 0x36:
      pcVar4 = "/";
      break;
    case 0x37:
      pcVar4 = "mod";
      break;
    case 0x38:
      pcVar4 = "%";
      break;
    case 0x39:
      pcVar4 = "**";
      break;
    case 0x3b:
      pcVar4 = "sqrt";
      break;
    case 0x3e:
      pcVar4 = "<";
      break;
    case 0x3f:
      pcVar4 = "<=";
      break;
    case 0x40:
      pcVar4 = ">=";
      break;
    case 0x41:
      pcVar4 = ">";
      break;
    case 0x42:
      pcVar4 = "==";
      break;
    case 0x43:
      pcVar4 = "!=";
      break;
    case 0x44:
      pcVar4 = "<<";
      break;
    case 0x45:
      pcVar4 = ">>";
      break;
    case 0x46:
      pcVar4 = "<<<";
      break;
    case 0x47:
      pcVar4 = ">>>";
      break;
    case 0x48:
      pcVar4 = "rotL";
      break;
    case 0x49:
      pcVar4 = "rotR";
      break;
    case 0x4b:
      pcVar4 = "lut";
      break;
    case 0x4d:
      pcVar4 = "table";
      break;
    case 0x59:
      pcVar4 = "DFFRSE";
      break;
    case 0x5b:
      pcVar4 = "[:]";
      break;
    case 0x5c:
      pcVar4 = "{}";
      break;
    case 0x5d:
      pcVar4 = "zPad";
      break;
    case 0x5e:
      pcVar4 = "sExt";
      break;
    case 0x5f:
      pcVar4 = "=>";
      break;
    case 0x60:
      pcVar4 = "squar";
      break;
    case 0x61:
      pcVar4 = "const";
    }
    printf("Obj %6d : Type = %6s  Fanins = %d : ",CONCAT44(in_register_00000034,iObj),pcVar4,
           (ulong)(uint)p->vFanins[uVar7].nSize);
    pWVar1 = p->vFanins;
    uVar3 = (ulong)(uint)pWVar1[uVar7].nSize;
    if (0 < pWVar1[uVar7].nSize) {
      lVar5 = uVar7 * 0x10 + 8;
      lVar6 = 0;
      do {
        if ((int)uVar3 < 3) {
          piVar2 = (int *)((long)&pWVar1->nCap + lVar5);
        }
        else {
          piVar2 = pWVar1[uVar7].field_2.pArray[0] + lVar6;
        }
        if (*piVar2 != 0) {
          printf("%5d ");
          pWVar1 = p->vFanins;
        }
        lVar6 = lVar6 + 1;
        uVar3 = (ulong)pWVar1[uVar7].nSize;
        lVar5 = lVar5 + 4;
      } while (lVar6 < (long)uVar3);
    }
    putchar(10);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wln_ObjPrint( Wln_Ntk_t * p, int iObj )
{
    int k, iFanin, Type = Wln_ObjType(p, iObj);
    printf( "Obj %6d : Type = %6s  Fanins = %d : ", iObj, Abc_OperName(Type), Wln_ObjFaninNum(p, iObj) );
    Wln_ObjForEachFanin( p, iObj, iFanin, k )
        printf( "%5d ", iFanin );
    printf( "\n" );
}